

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O3

EStatusCode __thiscall
Type1Input::CalculateDependenciesForCharIndex
          (Type1Input *this,string *inCharStringName,CharString1Dependencies *ioDependenciesInfo)

{
  EStatusCode EVar1;
  iterator iVar2;
  Trace *this_00;
  CharStringType1Interpreter interpreter;
  CharStringType1Interpreter CStack_68;
  
  CharStringType1Interpreter::CharStringType1Interpreter(&CStack_68);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>_>_>
          ::find(&(this->mCharStrings)._M_t,inCharStringName);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->mCharStrings)._M_t._M_impl.super__Rb_tree_header)
  {
    this_00 = Trace::DefaultTrace();
    EVar1 = eFailure;
    Trace::TraceToLog(this_00,
                      "Type1Input::CalculateDependenciesForCharIndex, Exception, cannot find glyph from name"
                     );
  }
  else {
    this->mCurrentDependencies = ioDependenciesInfo;
    EVar1 = CharStringType1Interpreter::Intepret
                      (&CStack_68,(Type1CharString *)(iVar2._M_node + 2),
                       (IType1InterpreterImplementation *)this);
    this->mCurrentDependencies = (CharString1Dependencies *)0x0;
  }
  CharStringType1Interpreter::~CharStringType1Interpreter(&CStack_68);
  return EVar1;
}

Assistant:

EStatusCode Type1Input::CalculateDependenciesForCharIndex(const std::string& inCharStringName,
											  CharString1Dependencies& ioDependenciesInfo)
{
	CharStringType1Interpreter interpreter;
	StringToType1CharStringMap::iterator it = mCharStrings.find(inCharStringName);

	if(it == mCharStrings.end())
	{
		TRACE_LOG("Type1Input::CalculateDependenciesForCharIndex, Exception, cannot find glyph from name");
		return eFailure;
	}

	mCurrentDependencies = &ioDependenciesInfo;
	EStatusCode status = interpreter.Intepret(it->second,this);
	mCurrentDependencies = NULL;
	return status;
}